

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventReportReliablePdu.cpp
# Opt level: O0

void __thiscall DIS::EventReportReliablePdu::EventReportReliablePdu(EventReportReliablePdu *this)

{
  EventReportReliablePdu *this_local;
  
  SimulationManagementWithReliabilityFamilyPdu::SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu.super_PduSuperclass.
  _vptr_PduSuperclass = (_func_int **)&PTR__EventReportReliablePdu_00267a10;
  this->_eventType = 0;
  this->_pad1 = 0;
  this->_numberOfFixedDatumRecords = 0;
  this->_numberOfVariableDatumRecords = 0;
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::vector(&this->_fixedDatumRecords);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::vector
            (&this->_variableDatumRecords);
  PduSuperclass::setPduType((PduSuperclass *)this,'=');
  return;
}

Assistant:

EventReportReliablePdu::EventReportReliablePdu() : SimulationManagementWithReliabilityFamilyPdu(),
   _eventType(0), 
   _pad1(0), 
   _numberOfFixedDatumRecords(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 61 );
}